

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_free(void *msp,void *ptr)

{
  malloc_tree_chunk *pmVar1;
  malloc_tree_chunk *pmVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  malloc_tree_chunk *pmVar6;
  ulong uVar7;
  long *plVar8;
  tchunkptr pmVar9;
  size_t *psVar10;
  long lVar11;
  byte bVar12;
  bool bVar13;
  byte local_198;
  tchunkptr F_5;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I_3;
  tbinptr *H_2;
  tchunkptr tp;
  mchunkptr F_4;
  mchunkptr B_2;
  bindex_t I_2;
  tchunkptr C1_1;
  tchunkptr C0_1;
  tbinptr *H_1;
  tchunkptr *CP_1;
  tchunkptr *RP_1;
  tchunkptr F_3;
  tchunkptr R_1;
  tchunkptr XP_1;
  tchunkptr TP_1;
  bindex_t I_1;
  mchunkptr B_1;
  mchunkptr F_2;
  size_t nsize;
  size_t dsize;
  size_t tsize;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F_1;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr TP;
  bindex_t I;
  mchunkptr B;
  mchunkptr F;
  mchunkptr prev;
  size_t prevsize;
  mchunkptr next;
  size_t psize;
  mstate fm;
  mchunkptr p;
  void *ptr_local;
  void *msp_local;
  
  if (ptr == (void *)0x0) {
    return (void *)0x0;
  }
  fm = (mstate)((long)ptr + -0x10);
  next = (mchunkptr)(*(ulong *)((long)ptr + -8) & 0xfffffffffffffffc);
  pmVar6 = (malloc_tree_chunk *)
           ((long)((malloc_state *)(fm->smallbins + -7))->smallbins + (long)&next[-2].head);
  if ((*(ulong *)((long)ptr + -8) & 1) == 0) {
    uVar7 = *(ulong *)fm;
    if ((uVar7 & 1) != 0) {
      CALL_MUNMAP((void *)((long)fm - (uVar7 & 0xfffffffffffffffe)),
                  (long)&next[1].prev_foot + (uVar7 & 0xfffffffffffffffe));
      return (void *)0x0;
    }
    fm = (mstate)((long)fm - uVar7);
    next = (mchunkptr)((long)&next->prev_foot + uVar7);
    if (fm == *(mstate *)((long)msp + 0x18)) {
      if ((pmVar6->head & 3) == 3) {
        *(mchunkptr *)((long)msp + 8) = next;
        pmVar6->head = pmVar6->head & 0xfffffffffffffffe;
        fm->dvsize = (ulong)next | 1;
        *(mchunkptr *)
         ((long)((malloc_state *)(fm->smallbins + -7))->smallbins + (long)&next[-2].head) = next;
        return (void *)0x0;
      }
    }
    else if (uVar7 >> 3 < 0x20) {
      pmVar1 = (malloc_tree_chunk *)fm->topsize;
      pmVar2 = (malloc_tree_chunk *)fm->dv;
      if (pmVar1 == pmVar2) {
        *(uint *)msp = (1 << ((byte)(uVar7 >> 3) & 0x1f) ^ 0xffffffffU) & *msp;
      }
      else {
        pmVar1->bk = pmVar2;
        pmVar2->fd = pmVar1;
      }
    }
    else {
      pmVar1 = (malloc_tree_chunk *)fm->release_checks;
      if ((mstate)fm->dv == fm) {
        CP = (tchunkptr *)&fm->trim_check;
        F_1 = (tchunkptr)fm->trim_check;
        if (F_1 == (tchunkptr)0x0) {
          CP = (tchunkptr *)&fm->top;
          F_1 = (tchunkptr)fm->top;
          if (F_1 == (tchunkptr)0x0) goto LAB_0015f86d;
        }
        while( true ) {
          H = F_1->child + 1;
          bVar13 = true;
          if (F_1->child[1] == (malloc_tree_chunk *)0x0) {
            H = F_1->child;
            bVar13 = F_1->child[0] != (malloc_tree_chunk *)0x0;
          }
          if (!bVar13) break;
          CP = H;
          F_1 = *H;
        }
        *CP = (tchunkptr)0x0;
      }
      else {
        pmVar2 = (malloc_tree_chunk *)fm->topsize;
        F_1 = (tchunkptr)fm->dv;
        pmVar2->bk = F_1;
        F_1->fd = pmVar2;
      }
LAB_0015f86d:
      if (pmVar1 != (malloc_tree_chunk *)0x0) {
        plVar8 = (long *)((long)msp + (long)fm->smallbins[0] * 8 + 0x248);
        if (fm == (mstate)*plVar8) {
          *plVar8 = (long)F_1;
          if (F_1 == (tchunkptr)0x0) {
            *(uint *)((long)msp + 4) =
                 (1 << ((byte)fm->smallbins[0] & 0x1f) ^ 0xffffffffU) & *(uint *)((long)msp + 4);
          }
        }
        else if ((mstate)pmVar1->child[0] == fm) {
          pmVar1->child[0] = F_1;
        }
        else {
          pmVar1->child[1] = F_1;
        }
        if (F_1 != (tchunkptr)0x0) {
          F_1->parent = pmVar1;
          pmVar1 = (malloc_tree_chunk *)fm->top;
          if (pmVar1 != (malloc_tree_chunk *)0x0) {
            F_1->child[0] = pmVar1;
            pmVar1->parent = F_1;
          }
          pmVar1 = (malloc_tree_chunk *)fm->trim_check;
          if (pmVar1 != (malloc_tree_chunk *)0x0) {
            F_1->child[1] = pmVar1;
            pmVar1->parent = F_1;
          }
        }
      }
    }
  }
  if ((pmVar6->head & 2) != 0) {
    pmVar6->head = pmVar6->head & 0xfffffffffffffffe;
    fm->dvsize = (ulong)next | 1;
    *(mchunkptr *)((long)((malloc_state *)(fm->smallbins + -7))->smallbins + (long)&next[-2].head) =
         next;
    goto LAB_0015feeb;
  }
  if (pmVar6 == *(malloc_tree_chunk **)((long)msp + 0x20)) {
    uVar7 = (long)&next->prev_foot + *(long *)((long)msp + 0x10);
    *(ulong *)((long)msp + 0x10) = uVar7;
    *(mstate *)((long)msp + 0x20) = fm;
    fm->dvsize = uVar7 | 1;
    if (fm == *(mstate *)((long)msp + 0x18)) {
      *(undefined8 *)((long)msp + 0x18) = 0;
      *(undefined8 *)((long)msp + 8) = 0;
    }
    if (uVar7 <= *(ulong *)((long)msp + 0x28)) {
      return (void *)0x0;
    }
    alloc_trim((mstate)msp,0);
    return (void *)0x0;
  }
  if (pmVar6 == *(malloc_tree_chunk **)((long)msp + 0x18)) {
    uVar7 = (long)&next->prev_foot + *(long *)((long)msp + 8);
    *(ulong *)((long)msp + 8) = uVar7;
    *(mstate *)((long)msp + 0x18) = fm;
    fm->dvsize = uVar7 | 1;
    *(ulong *)((long)fm->smallbins + (uVar7 - 0x38)) = uVar7;
    return (void *)0x0;
  }
  uVar7 = pmVar6->head;
  next = (mchunkptr)((long)&next->prev_foot + (uVar7 & 0xfffffffffffffffc));
  if (uVar7 >> 3 < 0x20) {
    pmVar1 = pmVar6->fd;
    pmVar6 = pmVar6->bk;
    if (pmVar1 == pmVar6) {
      *(uint *)msp = (1 << ((byte)(uVar7 >> 3) & 0x1f) ^ 0xffffffffU) & *msp;
    }
    else {
      pmVar1->bk = pmVar6;
      pmVar6->fd = pmVar1;
    }
  }
  else {
    pmVar1 = pmVar6->parent;
    if (pmVar6->bk == pmVar6) {
      CP_1 = pmVar6->child + 1;
      F_3 = pmVar6->child[1];
      if (F_3 == (tchunkptr)0x0) {
        CP_1 = pmVar6->child;
        F_3 = pmVar6->child[0];
        if (F_3 == (tchunkptr)0x0) goto LAB_0015fd14;
      }
      while( true ) {
        H_1 = F_3->child + 1;
        bVar13 = true;
        if (F_3->child[1] == (malloc_tree_chunk *)0x0) {
          H_1 = F_3->child;
          bVar13 = F_3->child[0] != (malloc_tree_chunk *)0x0;
        }
        if (!bVar13) break;
        CP_1 = H_1;
        F_3 = *H_1;
      }
      *CP_1 = (tchunkptr)0x0;
    }
    else {
      pmVar2 = pmVar6->fd;
      F_3 = pmVar6->bk;
      pmVar2->bk = F_3;
      F_3->fd = pmVar2;
    }
LAB_0015fd14:
    if (pmVar1 != (malloc_tree_chunk *)0x0) {
      plVar8 = (long *)((long)msp + pmVar6->index * 8 + 0x248);
      if (pmVar6 == (malloc_tree_chunk *)*plVar8) {
        *plVar8 = (long)F_3;
        if (F_3 == (tchunkptr)0x0) {
          *(uint *)((long)msp + 4) =
               (1 << ((byte)pmVar6->index & 0x1f) ^ 0xffffffffU) & *(uint *)((long)msp + 4);
        }
      }
      else if (pmVar1->child[0] == pmVar6) {
        pmVar1->child[0] = F_3;
      }
      else {
        pmVar1->child[1] = F_3;
      }
      if (F_3 != (tchunkptr)0x0) {
        F_3->parent = pmVar1;
        pmVar1 = pmVar6->child[0];
        if (pmVar1 != (malloc_tree_chunk *)0x0) {
          F_3->child[0] = pmVar1;
          pmVar1->parent = F_3;
        }
        pmVar6 = pmVar6->child[1];
        if (pmVar6 != (malloc_tree_chunk *)0x0) {
          F_3->child[1] = pmVar6;
          pmVar6->parent = F_3;
        }
      }
    }
  }
  fm->dvsize = (ulong)next | 1;
  *(mchunkptr *)((long)((malloc_state *)(fm->smallbins + -7))->smallbins + (long)&next[-2].head) =
       next;
  if (fm == *(mstate *)((long)msp + 0x18)) {
    *(mchunkptr *)((long)msp + 8) = next;
    return (void *)0x0;
  }
LAB_0015feeb:
  if ((ulong)next >> 3 < 0x20) {
    pmVar9 = (tchunkptr)((long)msp + ((ulong)next >> 3) * 0x10 + 0x38);
    bVar12 = (byte)((ulong)next >> 3);
    if ((*msp & 1 << (bVar12 & 0x1f)) == 0) {
      *(uint *)msp = 1 << (bVar12 & 0x1f) | *msp;
      tp = pmVar9;
    }
    else {
      tp = pmVar9->fd;
    }
    pmVar9->fd = (malloc_tree_chunk *)fm;
    tp->bk = (malloc_tree_chunk *)fm;
    fm->topsize = (size_t)tp;
    fm->dv = (mchunkptr)pmVar9;
  }
  else {
    uVar5 = (uint)((ulong)next >> 8);
    if (uVar5 == 0) {
      _K = (mchunkptr)0x0;
    }
    else if (uVar5 < 0x10000) {
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      _K = (mchunkptr)((ulong)(uint)(iVar4 << 1) + ((ulong)next >> ((char)iVar4 + 7U & 0x3f) & 1));
    }
    else {
      _K = (mchunkptr)0x1f;
    }
    psVar10 = (size_t *)((long)msp + (long)_K * 8 + 0x248);
    fm->smallbins[0] = _K;
    fm->trim_check = 0;
    fm->top = (mchunkptr)0x0;
    if ((*(uint *)((long)msp + 4) & 1 << ((byte)_K & 0x1f)) == 0) {
      *(uint *)((long)msp + 4) = 1 << ((byte)_K & 0x1f) | *(uint *)((long)msp + 4);
      *psVar10 = (size_t)fm;
      fm->release_checks = (size_t)psVar10;
      fm->dv = (mchunkptr)fm;
      fm->topsize = (size_t)fm;
    }
    else {
      K_1 = *psVar10;
      if (_K == (mchunkptr)0x1f) {
        local_198 = 0;
      }
      else {
        local_198 = 0x3f - ((char)((ulong)_K >> 1) + '\x06');
      }
      C = (tchunkptr *)((long)next << (local_198 & 0x3f));
      while ((mchunkptr)(*(ulong *)(K_1 + 8) & 0xfffffffffffffffc) != next) {
        psVar10 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
        C = (tchunkptr *)((long)C << 1);
        if (*psVar10 == 0) {
          *psVar10 = (size_t)fm;
          fm->release_checks = K_1;
          fm->dv = (mchunkptr)fm;
          fm->topsize = (size_t)fm;
          goto LAB_001602ab;
        }
        K_1 = *psVar10;
      }
      sVar3 = *(size_t *)(K_1 + 0x10);
      *(mstate *)(sVar3 + 0x18) = fm;
      *(mstate *)(K_1 + 0x10) = fm;
      fm->topsize = sVar3;
      fm->dv = (mchunkptr)K_1;
      fm->release_checks = 0;
    }
LAB_001602ab:
    lVar11 = *(long *)((long)msp + 0x30) + -1;
    *(long *)((long)msp + 0x30) = lVar11;
    if (lVar11 == 0) {
      release_unused_segments((mstate)msp);
    }
  }
  return (void *)0x0;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_free(void *msp, void *ptr)
{
  if (ptr != 0) {
    mchunkptr p = mem2chunk(ptr);
    mstate fm = (mstate)msp;
    size_t psize = chunksize(p);
    mchunkptr next = chunk_plus_offset(p, psize);
    if (!pinuse(p)) {
      size_t prevsize = p->prev_foot;
      if ((prevsize & IS_DIRECT_BIT) != 0) {
	prevsize &= ~IS_DIRECT_BIT;
	psize += prevsize + DIRECT_FOOT_PAD;
	CALL_MUNMAP((char *)p - prevsize, psize);
	return NULL;
      } else {
	mchunkptr prev = chunk_minus_offset(p, prevsize);
	psize += prevsize;
	p = prev;
	/* consolidate backward */
	if (p != fm->dv) {
	  unlink_chunk(fm, p, prevsize);
	} else if ((next->head & INUSE_BITS) == INUSE_BITS) {
	  fm->dvsize = psize;
	  set_free_with_pinuse(p, psize, next);
	  return NULL;
	}
      }
    }
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == fm->top) {
	size_t tsize = fm->topsize += psize;
	fm->top = p;
	p->head = tsize | PINUSE_BIT;
	if (p == fm->dv) {
	  fm->dv = 0;
	  fm->dvsize = 0;
	}
	if (tsize > fm->trim_check)
	  alloc_trim(fm, 0);
	return NULL;
      } else if (next == fm->dv) {
	size_t dsize = fm->dvsize += psize;
	fm->dv = p;
	set_size_and_pinuse_of_free_chunk(p, dsize);
	return NULL;
      } else {
	size_t nsize = chunksize(next);
	psize += nsize;
	unlink_chunk(fm, next, nsize);
	set_size_and_pinuse_of_free_chunk(p, psize);
	if (p == fm->dv) {
	  fm->dvsize = psize;
	  return NULL;
	}
      }
    } else {
      set_free_with_pinuse(p, psize, next);
    }

    if (is_small(psize)) {
      insert_small_chunk(fm, p, psize);
    } else {
      tchunkptr tp = (tchunkptr)p;
      insert_large_chunk(fm, tp, psize);
      if (--fm->release_checks == 0)
	release_unused_segments(fm);
    }
  }
  return NULL;
}